

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooleanDatatypeValidator.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::BooleanDatatypeValidator::getCanonicalRepresentation
          (BooleanDatatypeValidator *this,XMLCh *rawData,MemoryManager *memMgr,bool toValidate)

{
  bool bVar1;
  XMLCh *local_68;
  MemoryManager *local_60;
  BooleanDatatypeValidator *temp;
  MemoryManager *toUse;
  bool toValidate_local;
  MemoryManager *memMgr_local;
  XMLCh *rawData_local;
  BooleanDatatypeValidator *this_local;
  
  local_60 = memMgr;
  if (memMgr == (MemoryManager *)0x0) {
    local_60 = DatatypeValidator::getMemoryManager(&this->super_DatatypeValidator);
  }
  if (toValidate) {
    (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0xc])
              (this,rawData,0,0,local_60);
  }
  bVar1 = XMLString::equals(rawData,(XMLCh *)XMLUni::fgBooleanValueSpace);
  if ((bVar1) ||
     (bVar1 = XMLString::equals(rawData,(XMLCh *)(XMLUni::fgBooleanValueSpace + 0x20)), bVar1)) {
    local_68 = XMLString::replicate((XMLCh *)XMLUni::fgBooleanValueSpace,local_60);
  }
  else {
    local_68 = XMLString::replicate((XMLCh *)(XMLUni::fgBooleanValueSpace + 0x10),local_60);
  }
  return local_68;
}

Assistant:

const XMLCh* BooleanDatatypeValidator::getCanonicalRepresentation(const XMLCh*         const rawData
                                                                ,       MemoryManager* const memMgr
                                                                ,       bool           toValidate) const
{

    MemoryManager* toUse = memMgr? memMgr : getMemoryManager();
    
    if (toValidate)
    {
        BooleanDatatypeValidator *temp = (BooleanDatatypeValidator*) this;

        try
        {
            temp->checkContent(rawData, 0, false, toUse);   
        }
        catch (...)
        {
            return 0;
        }
    }

    return ( XMLString::equals(rawData, XMLUni::fgBooleanValueSpace[0]) ||
             XMLString::equals(rawData, XMLUni::fgBooleanValueSpace[2])  ) ?
             XMLString::replicate(XMLUni::fgBooleanValueSpace[0], toUse) :
             XMLString::replicate(XMLUni::fgBooleanValueSpace[1], toUse) ;

}